

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::InstrumentPass::GetBoolId(InstrumentPass *this)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *type;
  Bool bool_ty;
  Type local_40;
  
  if (this->bool_id_ != 0) {
    return this->bool_id_;
  }
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.kind_ = kBool;
  local_40._vptr_Type = (_func_int **)&PTR__Type_003aed10;
  type = analysis::TypeManager::GetRegisteredType(this_00,&local_40);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,type);
  this->bool_id_ = uVar1;
  analysis::Type::~Type(&local_40);
  return this->bool_id_;
}

Assistant:

uint32_t InstrumentPass::GetBoolId() {
  if (bool_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Bool bool_ty;
    analysis::Type* reg_bool_ty = type_mgr->GetRegisteredType(&bool_ty);
    bool_id_ = type_mgr->GetTypeInstruction(reg_bool_ty);
  }
  return bool_id_;
}